

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderBuiltinConstantCase::getRefValue(ShaderBuiltinConstantCase *this)

{
  ContextInfo *pCVar1;
  bool bVar2;
  ShaderBuiltinConstantCase *this_local;
  
  bVar2 = std::operator==(&this->m_varName,"gl_MaxDrawBuffers");
  if (bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      ((this->super_ShaderRenderCase).m_ctxInfo,"GL_EXT_draw_buffers");
    if (bVar2) {
      pCVar1 = (this->super_ShaderRenderCase).m_ctxInfo;
      this_local._4_4_ = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,0x8824);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    pCVar1 = (this->super_ShaderRenderCase).m_ctxInfo;
    this_local._4_4_ = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,(ulong)this->m_paramName);
  }
  return this_local._4_4_;
}

Assistant:

int ShaderBuiltinConstantCase::getRefValue (void)
{
	if (m_varName == "gl_MaxDrawBuffers")
	{
		if (m_ctxInfo.isExtensionSupported("GL_EXT_draw_buffers"))
			return m_ctxInfo.getInt(GL_MAX_DRAW_BUFFERS);
		else
			return 1;
	}
	else
	{
		DE_ASSERT(m_paramName != GL_NONE);
		return m_ctxInfo.getInt(m_paramName);
	}
}